

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# print.hpp
# Opt level: O1

void __thiscall
njoy::ENDFtk::record::IntegerBase<5u,9u>::print<std::back_insert_iterator<std::__cxx11::string>>
          (IntegerBase<5u,9u> *this,
          back_insert_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          *it,int MAT,int MF,int MT)

{
  uint *puVar1;
  int iVar2;
  uint *puVar3;
  int iVar4;
  int value;
  uint local_40;
  int local_3c;
  int local_38;
  int local_34;
  
  local_40 = *(uint *)this;
  local_3c = MT;
  local_38 = MF;
  local_34 = MAT;
  tools::disco::Integer<5u>::write<unsigned_int,std::back_insert_iterator<std::__cxx11::string>>
            (&local_40,it);
  local_40 = *(uint *)(this + 4);
  tools::disco::Integer<5u>::write<unsigned_int,std::back_insert_iterator<std::__cxx11::string>>
            (&local_40,it);
  std::__cxx11::string::push_back((char)it->container);
  puVar3 = *(uint **)(this + 8);
  puVar1 = *(uint **)(this + 0x10);
  if (puVar3 != puVar1) {
    do {
      local_40 = *puVar3;
      tools::disco::Integer<6u>::write<int,std::back_insert_iterator<std::__cxx11::string>>
                ((int *)&local_40,it);
      puVar3 = puVar3 + 1;
    } while (puVar3 != puVar1);
  }
  std::__cxx11::string::push_back((char)it->container);
  iVar2 = (int)((ulong)(*(long *)(this + 0x10) - *(long *)(this + 8)) >> 2);
  if (iVar2 != 9) {
    iVar2 = 9 - iVar2;
    do {
      iVar4 = 6;
      do {
        std::__cxx11::string::push_back((char)it->container);
        iVar4 = iVar4 + -1;
      } while (iVar4 != 0);
      iVar2 = iVar2 + -1;
    } while (iVar2 != 0);
  }
  tools::disco::
  Record<njoy::tools::disco::Integer<4u>,njoy::tools::disco::Integer<2u>,njoy::tools::disco::Integer<3u>,njoy::tools::disco::Column<5u>>
  ::write<std::back_insert_iterator<std::__cxx11::string>,int,int,int>
            (it,&local_34,&local_38,&local_3c);
  return;
}

Assistant:

void print( OutputIterator& it, int MAT, int MF, int MT ) const {

  using namespace njoy::tools;

  record::Integer< 5 >::Parser::write( this->I(), it );
  record::Integer< 5 >::Parser::write( this->J(), it );

  if ( NDIGIT != 6 ) { disco::Column< 1 >::write( it ); };

  for ( auto value : this->K() ) {

    record::Integer< NDIGIT + 1 >::Parser::write( value, it );
  }

  switch ( NDIGIT ) {

    case 2: { disco::Column< 1 >::write( it ); break; }
    case 3: { disco::Column< 3 >::write( it ); break; }
    case 5: { disco::Column< 1 >::write( it ); break; }
    default: { /* unreachable */ break; }
  }

  int blankEntries = N - this->K().size();
  while ( blankEntries-- ){ disco::Column< NDIGIT + 1 >::write( it ); }

  using Format =
    disco::Record< disco::Integer< 4 >, disco::Integer< 2 >,
                   disco::Integer< 3 >, disco::Column< 5 > >;

  Format::write( it, MAT, MF, MT );
}